

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey.c
# Opt level: O1

void surv0_pipe_recv_cb(void *arg)

{
  nni_aio *aio;
  long lVar1;
  _Bool _Var2;
  nng_err nVar3;
  uint32_t uVar4;
  nni_msg *m;
  size_t sVar5;
  void *pvVar6;
  nni_aio *aio_00;
  
  lVar1 = *(long *)((long)arg + 8);
  aio = (nni_aio *)((long)arg + 0x230);
  nVar3 = nni_aio_result(aio);
  if (nVar3 != NNG_OK) {
LAB_0012da9b:
    nni_pipe_close(*arg);
    return;
  }
  m = nni_aio_get_msg(aio);
  nni_aio_set_msg(aio,(nni_msg *)0x0);
  uVar4 = nni_pipe_id(*arg);
  nni_msg_set_pipe(m,uVar4);
  sVar5 = nni_msg_len(m);
  if (sVar5 < 4) {
    nni_msg_free(m);
    goto LAB_0012da9b;
  }
  uVar4 = nni_msg_trim_u32(m);
  nni_msg_header_append_u32(m,uVar4);
  nni_mtx_lock((nni_mtx *)(lVar1 + 0x20));
  pvVar6 = nni_id_get((nni_id_map *)(lVar1 + 0xd0),(ulong)uVar4);
  if (pvVar6 != (void *)0x0) {
    _Var2 = nni_lmq_full((nni_lmq *)((long)pvVar6 + 0x10));
    if (!_Var2) {
      aio_00 = (nni_aio *)nni_list_first((nni_list *)((long)pvVar6 + 0x58));
      if (aio_00 == (nni_aio *)0x0) {
        nni_lmq_put((nni_lmq *)((long)pvVar6 + 0x10),m);
        if (pvVar6 == (void *)(lVar1 + 0x48)) {
          nni_pollable_raise((nni_pollable *)(lVar1 + 0x118));
        }
      }
      else {
        nni_list_remove((nni_list *)((long)pvVar6 + 0x58),aio_00);
        nni_aio_finish_msg(aio_00,m);
      }
      goto LAB_0012db57;
    }
  }
  nni_msg_free(m);
LAB_0012db57:
  nni_mtx_unlock((nni_mtx *)(lVar1 + 0x20));
  nni_pipe_recv(*arg,aio);
  return;
}

Assistant:

static void
surv0_pipe_recv_cb(void *arg)
{
	surv0_pipe *p    = arg;
	surv0_sock *sock = p->sock;
	surv0_ctx  *ctx;
	nni_msg    *msg;
	uint32_t    id;
	nni_aio    *aio;

	if (nni_aio_result(&p->aio_recv) != 0) {
		nni_pipe_close(p->pipe);
		return;
	}

	msg = nni_aio_get_msg(&p->aio_recv);
	nni_aio_set_msg(&p->aio_recv, NULL);
	nni_msg_set_pipe(msg, nni_pipe_id(p->pipe));

	// We yank 4 bytes of body, and move them to the header.
	if (nni_msg_len(msg) < 4) {
		// Peer sent us garbage.  Kick it.
		nni_msg_free(msg);
		nni_pipe_close(p->pipe);
		return;
	}
	id = nni_msg_trim_u32(msg);
	nni_msg_header_append_u32(msg, id);

	nni_mtx_lock(&sock->mtx);
	// Best effort at delivery.  Discard if no context or context is
	// unable to receive it.
	if (((ctx = nni_id_get(&sock->surveys, id)) == NULL) ||
	    (nni_lmq_full(&ctx->recv_lmq))) {
		nni_msg_free(msg);
	} else if ((aio = nni_list_first(&ctx->recv_queue)) != NULL) {
		nni_list_remove(&ctx->recv_queue, aio);
		nni_aio_finish_msg(aio, msg);
	} else {
		nni_lmq_put(&ctx->recv_lmq, msg);
		if (ctx == &sock->ctx) {
			nni_pollable_raise(&sock->readable);
		}
	}
	nni_mtx_unlock(&sock->mtx);

	nni_pipe_recv(p->pipe, &p->aio_recv);
}